

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeRecordSet.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::AttributeRecordSet::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,AttributeRecordSet *this)

{
  pointer pKVar1;
  ostream *poVar2;
  KCHAR8 in_CL;
  pointer pKVar3;
  KString local_1f8;
  KString local_1d8;
  KStringStream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_1a8,"AttributeRecordSet:");
  poVar2 = std::operator<<(poVar2,"\n\tEntity ID:\n");
  EntityIdentifier::GetAsString_abi_cxx11_(&local_1f8,&this->m_EntityID);
  UTILS::IndentString(&local_1d8,&local_1f8,2,in_CL);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  poVar2 = std::operator<<(poVar2,"\n\tNumber Of Attribute Records: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumAttrRecs);
  std::operator<<(poVar2,"\n\tRecords:\n");
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  pKVar1 = (this->m_vAttrRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar3 = (this->m_vAttrRec).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar3 != pKVar1; pKVar3 = pKVar3 + 1) {
    (*(pKVar3->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_1f8);
    UTILS::IndentString(&local_1d8,&local_1f8,1,in_CL);
    std::operator<<(local_1a8,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString AttributeRecordSet::GetAsString() const
{
    KStringStream ss;

    ss << "AttributeRecordSet:"
       << "\n\tEntity ID:\n" << IndentString( m_EntityID.GetAsString(), 2 )
       << "\n\tNumber Of Attribute Records: " << m_ui16NumAttrRecs 
       << "\n\tRecords:\n";

    vector<StdVarPtr>::const_iterator citr = m_vAttrRec.begin();
    vector<StdVarPtr>::const_iterator citrEnd = m_vAttrRec.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << IndentString( ( *citr )->GetAsString(), 1 );
    }

    return ss.str();
}